

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void check_forwarding(mock_allocator<int> *alloc,allocator_ref<mock_allocator<int>_> *ref)

{
  MockSpec<int_*(unsigned_long)> *this;
  TypedExpectation<int_*(unsigned_long)> *this_00;
  MockSpec<void_(int_*,_unsigned_long)> *this_01;
  int mem;
  MatcherBase<unsigned_long> local_50;
  MatcherBase<unsigned_long> local_38;
  int *local_20;
  
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_38,0x2a);
  this = mock_allocator<int>::gmock_allocate(alloc,(Matcher<unsigned_long> *)&local_38);
  this_00 = testing::internal::MockSpec<int_*(unsigned_long)>::InternalExpectedAt
                      (this,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                       ,0x109,"alloc","allocate(42)");
  local_20 = &mem;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&local_50);
  testing::internal::TypedExpectation<int_*(unsigned_long)>::WillOnce
            (this_00,(Action<int_*(unsigned_long)> *)&local_50);
  testing::internal::linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<int_*(unsigned_long)>_> *)&local_50);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_38);
  allocator_ref<mock_allocator<int>_>::allocate(ref,0x2a);
  testing::Matcher<int_*>::Matcher((Matcher<int_*> *)&local_38,&mem);
  testing::Matcher<unsigned_long>::Matcher((Matcher<unsigned_long> *)&local_50,0x2a);
  this_01 = mock_allocator<int>::gmock_deallocate
                      (alloc,(Matcher<int_*> *)&local_38,(Matcher<unsigned_long> *)&local_50);
  testing::internal::MockSpec<void_(int_*,_unsigned_long)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x10b,"alloc","deallocate(ptr, 42)");
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase(&local_50);
  testing::internal::MatcherBase<int_*>::~MatcherBase((MatcherBase<int_*> *)&local_38);
  allocator_ref<mock_allocator<int>_>::deallocate(ref,&mem,0x2a);
  return;
}

Assistant:

static void check_forwarding(
    mock_allocator<int> &alloc, allocator_ref<mock_allocator<int>> &ref) {
  int mem;
  // Check if value_type is properly defined.
  allocator_ref< mock_allocator<int> >::value_type *ptr = &mem;
  // Check forwarding.
  EXPECT_CALL(alloc, allocate(42)).WillOnce(testing::Return(ptr));
  ref.allocate(42);
  EXPECT_CALL(alloc, deallocate(ptr, 42));
  ref.deallocate(ptr, 42);
}